

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StopFreezePdu.cpp
# Opt level: O0

int __thiscall DIS::StopFreezePdu::getMarshalledSize(StopFreezePdu *this)

{
  int iVar1;
  int iVar2;
  int marshalSize;
  StopFreezePdu *this_local;
  
  iVar1 = SimulationManagementFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementFamilyPdu);
  iVar2 = ClockTime::getMarshalledSize(&this->_realWorldTime);
  return iVar1 + iVar2 + 8;
}

Assistant:

int StopFreezePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _realWorldTime.getMarshalledSize();  // _realWorldTime
   marshalSize = marshalSize + 1;  // _reason
   marshalSize = marshalSize + 1;  // _frozenBehavior
   marshalSize = marshalSize + 2;  // _padding1
   marshalSize = marshalSize + 4;  // _requestID
    return marshalSize;
}